

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_write_certificate_verify(mbedtls_ssl_context *ssl)

{
  mbedtls_key_exchange_type_t mVar1;
  mbedtls_ssl_ciphersuite_t *pmVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  uchar uVar4;
  int iVar5;
  mbedtls_ssl_key_cert *pmVar6;
  int iVar7;
  size_t hash_len;
  mbedtls_pk_context *pmVar8;
  char *text;
  long lVar9;
  uchar *hash_00;
  mbedtls_md_type_t md_alg;
  bool bVar10;
  size_t n;
  uchar hash [48];
  undefined8 local_60;
  uchar local_58 [16];
  uchar local_48 [32];
  
  pmVar2 = ssl->transform_negotiate->ciphersuite_info;
  local_60 = 0;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0xbd2,"=> write certificate verify");
  iVar5 = mbedtls_ssl_derive_keys(ssl);
  if (iVar5 == 0) {
    mVar1 = pmVar2->key_exchange;
    if ((mVar1 - MBEDTLS_KEY_EXCHANGE_PSK < 4) || (mVar1 == MBEDTLS_KEY_EXCHANGE_ECJPAKE)) {
      iVar7 = 0xbe0;
    }
    else {
      if (ssl->client_auth != 0) {
        pmVar3 = ssl->handshake;
        if ((pmVar3 == (mbedtls_ssl_handshake_params *)0x0) ||
           (pmVar6 = pmVar3->key_cert, pmVar6 == (mbedtls_ssl_key_cert *)0x0)) {
          pmVar6 = ssl->conf->key_cert;
        }
        if ((pmVar6 != (mbedtls_ssl_key_cert *)0x0) && (pmVar6->cert != (mbedtls_x509_crt *)0x0)) {
          if ((pmVar3 == (mbedtls_ssl_handshake_params *)0x0) ||
             (pmVar6 = pmVar3->key_cert, pmVar6 == (mbedtls_ssl_key_cert *)0x0)) {
            pmVar6 = ssl->conf->key_cert;
          }
          if ((pmVar6 == (mbedtls_ssl_key_cert *)0x0) || (pmVar6->key == (mbedtls_pk_context *)0x0))
          {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0xbee,"got no private key for certificate");
            return -0x7600;
          }
          hash_00 = local_58;
          (*pmVar3->calc_verify)(ssl,hash_00);
          if (ssl->minor_ver == 3) {
            bVar10 = ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384;
            ssl->out_msg[4] = bVar10 + '\x04';
            if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
               (pmVar6 = ssl->handshake->key_cert, pmVar6 == (mbedtls_ssl_key_cert *)0x0)) {
              pmVar6 = ssl->conf->key_cert;
            }
            if (pmVar6 == (mbedtls_ssl_key_cert *)0x0) {
              pmVar8 = (mbedtls_pk_context *)0x0;
            }
            else {
              pmVar8 = pmVar6->key;
            }
            md_alg = bVar10 | MBEDTLS_MD_SHA256;
            uVar4 = mbedtls_ssl_sig_from_pk(pmVar8);
            ssl->out_msg[5] = uVar4;
            lVar9 = 2;
            hash_len = 0;
          }
          else {
            if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
               (pmVar6 = ssl->handshake->key_cert, pmVar6 == (mbedtls_ssl_key_cert *)0x0)) {
              pmVar6 = ssl->conf->key_cert;
            }
            md_alg = MBEDTLS_MD_NONE;
            if (pmVar6 == (mbedtls_ssl_key_cert *)0x0) {
              pmVar8 = (mbedtls_pk_context *)0x0;
            }
            else {
              pmVar8 = pmVar6->key;
            }
            iVar5 = mbedtls_pk_can_do(pmVar8,MBEDTLS_PK_ECDSA);
            if (iVar5 == 0) {
              hash_len = 0x24;
              lVar9 = 0;
            }
            else {
              hash_len = 0x14;
              hash_00 = local_48;
              lVar9 = 0;
              md_alg = MBEDTLS_MD_SHA1;
            }
          }
          if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
             (pmVar6 = ssl->handshake->key_cert, pmVar6 == (mbedtls_ssl_key_cert *)0x0)) {
            pmVar6 = ssl->conf->key_cert;
          }
          if (pmVar6 == (mbedtls_ssl_key_cert *)0x0) {
            pmVar8 = (mbedtls_pk_context *)0x0;
          }
          else {
            pmVar8 = pmVar6->key;
          }
          iVar5 = mbedtls_pk_sign(pmVar8,md_alg,hash_00,hash_len,ssl->out_msg + lVar9 + 6,&local_60,
                                  (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                                  ssl->conf->p_rng);
          if (iVar5 == 0) {
            ssl->out_msg[lVar9 + 4] = local_60._1_1_;
            ssl->out_msg[lVar9 + 5] = (uchar)local_60;
            ssl->out_msglen = lVar9 + 6 + local_60;
            ssl->out_msgtype = 0x16;
            *ssl->out_msg = '\x0f';
            ssl->state = ssl->state + 1;
            iVar5 = mbedtls_ssl_write_record(ssl);
            if (iVar5 == 0) {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                         ,0xc58,"<= write certificate verify");
              return 0;
            }
            text = "mbedtls_ssl_write_record";
            iVar7 = 0xc54;
          }
          else {
            text = "mbedtls_pk_sign";
            iVar7 = 0xc45;
          }
          goto LAB_0011c94c;
        }
      }
      iVar7 = 0xbe7;
    }
    iVar5 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,iVar7,"<= skip write certificate verify");
    ssl->state = ssl->state + 1;
  }
  else {
    text = "mbedtls_ssl_derive_keys";
    iVar7 = 0xbd6;
LAB_0011c94c:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,iVar7,text,iVar5);
  }
  return iVar5;
}

Assistant:

static int ssl_write_certificate_verify( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    size_t n = 0, offset = 0;
    unsigned char hash[48];
    unsigned char *hash_start = hash;
    mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;
    unsigned int hashlen;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write certificate verify" ) );

    if( ( ret = mbedtls_ssl_derive_keys( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_derive_keys", ret );
        return( ret );
    }

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate verify" ) );
        ssl->state++;
        return( 0 );
    }

    if( ssl->client_auth == 0 || mbedtls_ssl_own_cert( ssl ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate verify" ) );
        ssl->state++;
        return( 0 );
    }

    if( mbedtls_ssl_own_key( ssl ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no private key for certificate" ) );
        return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
    }

    /*
     * Make an RSA signature of the handshake digests
     */
    ssl->handshake->calc_verify( ssl, hash );

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /*
         * digitally-signed struct {
         *     opaque md5_hash[16];
         *     opaque sha_hash[20];
         * };
         *
         * md5_hash
         *     MD5(handshake_messages);
         *
         * sha_hash
         *     SHA(handshake_messages);
         */
        hashlen = 36;
        md_alg = MBEDTLS_MD_NONE;

        /*
         * For ECDSA, default hash is SHA-1 only
         */
        if( mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_ECDSA ) )
        {
            hash_start += 16;
            hashlen -= 16;
            md_alg = MBEDTLS_MD_SHA1;
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /*
         * digitally-signed struct {
         *     opaque handshake_messages[handshake_messages_length];
         * };
         *
         * Taking shortcut here. We assume that the server always allows the
         * PRF Hash function and has sent it in the allowed signature
         * algorithms list received in the Certificate Request message.
         *
         * Until we encounter a server that does not, we will take this
         * shortcut.
         *
         * Reason: Otherwise we should have running hashes for SHA512 and SHA224
         *         in order to satisfy 'weird' needs from the server side.
         */
        if( ssl->transform_negotiate->ciphersuite_info->mac ==
            MBEDTLS_MD_SHA384 )
        {
            md_alg = MBEDTLS_MD_SHA384;
            ssl->out_msg[4] = MBEDTLS_SSL_HASH_SHA384;
        }
        else
        {
            md_alg = MBEDTLS_MD_SHA256;
            ssl->out_msg[4] = MBEDTLS_SSL_HASH_SHA256;
        }
        ssl->out_msg[5] = mbedtls_ssl_sig_from_pk( mbedtls_ssl_own_key( ssl ) );

        /* Info from md_alg will be used instead */
        hashlen = 0;
        offset = 2;
    }
    else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    if( ( ret = mbedtls_pk_sign( mbedtls_ssl_own_key( ssl ), md_alg, hash_start, hashlen,
                         ssl->out_msg + 6 + offset, &n,
                         ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_sign", ret );
        return( ret );
    }

    ssl->out_msg[4 + offset] = (unsigned char)( n >> 8 );
    ssl->out_msg[5 + offset] = (unsigned char)( n      );

    ssl->out_msglen  = 6 + n + offset;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CERTIFICATE_VERIFY;

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write certificate verify" ) );

    return( ret );
}